

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool is_descriptor;
  bool bVar1;
  
  is_descriptor = std::operator==(parameter,"internal");
  if (is_descriptor) {
    bVar1 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             file,&kDescriptorFile_abi_cxx11_);
    if (!bVar1) {
LAB_00265a77:
      GenerateFile(file,is_descriptor,generator_context);
      return true;
    }
  }
  else if (*(int *)(file + 0x8c) == 3) goto LAB_00265a77;
  std::__cxx11::string::assign((char *)error);
  return false;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const string& parameter,
                         GeneratorContext* generator_context,
                         string* error) const {
  bool is_descriptor = parameter == "internal";

  if (is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, is_descriptor, generator_context);

  return true;
}